

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_frommesh.cpp
# Opt level: O0

void __thiscall ON_NgonBoundaryChecker::Internal_Reset(ON_NgonBoundaryChecker *this)

{
  uint local_14;
  uint i;
  ON_NgonBoundaryChecker *this_local;
  
  ON_FixedSizePool::ReturnAll(&this->m_fsp);
  for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
    this->m_hash_table[local_14] = (ON_NgonBoundaryComponent *)0x0;
  }
  this->m_vertex_count = 0;
  this->m_edge_count = 0;
  this->m_bIsSimple = false;
  this->m_bIsNotSimple = false;
  return;
}

Assistant:

void ON_NgonBoundaryChecker::Internal_Reset()
{
  m_fsp.ReturnAll();
  for (unsigned i = 0; i < ON_NgonBoundaryChecker::HashTableSize; ++i)
    m_hash_table[i] = nullptr;
  m_vertex_count = 0;
  m_edge_count = 0;
  m_bIsSimple = false;
  m_bIsNotSimple = false;
}